

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

bool __thiscall ccs::CcsContext::getBool(CcsContext *this,string *propertyName)

{
  int iVar1;
  CcsProperty *pCVar2;
  no_such_property *this_00;
  CcsProperty *pCVar3;
  CcsContext local_30;
  
  pCVar2 = SearchState::findProperty
                     ((this->searchState).
                      super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this,
                      propertyName);
  pCVar3 = (CcsProperty *)&(anonymous_namespace)::Missing;
  if (pCVar2 != (CcsProperty *)0x0) {
    pCVar3 = pCVar2;
  }
  iVar1 = (*pCVar3->_vptr_CcsProperty[2])(pCVar3);
  if ((char)iVar1 != '\0') {
    iVar1 = (*pCVar3->_vptr_CcsProperty[7])(pCVar3);
    return SUB41(iVar1,0);
  }
  this_00 = (no_such_property *)__cxa_allocate_exception(0x38);
  local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->searchState).super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->searchState).super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  no_such_property::no_such_property(this_00,propertyName,&local_30);
  __cxa_throw(this_00,&no_such_property::typeinfo,no_such_property::~no_such_property);
}

Assistant:

bool CcsContext::getBool(const std::string &propertyName) const {
  const CcsProperty &prop(getProperty(propertyName));
  if (!prop.exists()) throw no_such_property(propertyName, *this);
  return prop.boolValue();
}